

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

Curl_sh_entry * sh_addentry(curl_hash *sh,curl_socket_t s,Curl_easy *data)

{
  void *pvVar1;
  Curl_sh_entry *check;
  Curl_sh_entry *there;
  Curl_easy *data_local;
  curl_hash *pcStack_18;
  curl_socket_t s_local;
  curl_hash *sh_local;
  
  data_local._4_4_ = s;
  pcStack_18 = sh;
  sh_local = (curl_hash *)sh_getentry(sh,s);
  if (sh_local == (curl_hash *)0x0) {
    sh_local = (curl_hash *)(*Curl_ccalloc)(1,0x18);
    if (sh_local == (curl_hash *)0x0) {
      sh_local = (curl_hash *)0x0;
    }
    else {
      sh_local->table = (curl_llist *)data;
      *(curl_socket_t *)((long)&sh_local->hash_func + 4) = data_local._4_4_;
      pvVar1 = Curl_hash_add(pcStack_18,(void *)((long)&data_local + 4),4,sh_local);
      if (pvVar1 == (void *)0x0) {
        (*Curl_cfree)(sh_local);
        sh_local = (curl_hash *)0x0;
      }
    }
  }
  return (Curl_sh_entry *)sh_local;
}

Assistant:

static struct Curl_sh_entry *sh_addentry(struct curl_hash *sh,
                                         curl_socket_t s,
                                         struct Curl_easy *data)
{
  struct Curl_sh_entry *there = sh_getentry(sh, s);
  struct Curl_sh_entry *check;

  if(there)
    /* it is present, return fine */
    return there;

  /* not present, add it */
  check = calloc(1, sizeof(struct Curl_sh_entry));
  if(!check)
    return NULL; /* major failure */

  check->easy = data;
  check->socket = s;

  /* make/add new hash entry */
  if(!Curl_hash_add(sh, (char *)&s, sizeof(curl_socket_t), check)) {
    free(check);
    return NULL; /* major failure */
  }

  return check; /* things are good in sockhash land */
}